

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

Value<google::protobuf::internal::GenericTypeHandler<std::string>_> * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>
          (RepeatedPtrFieldBase *this,int index)

{
  void **ppvVar1;
  string *psVar2;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *extraout_RAX;
  Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *pVVar3;
  long *plVar4;
  long local_20 [2];
  
  if (index < 0) {
    psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                       ((long)index,0,"index >= 0");
  }
  else {
    psVar2 = (string *)0x0;
  }
  if (psVar2 == (string *)0x0) {
    if (index < this->current_size_) {
      psVar2 = (string *)0x0;
    }
    else {
      psVar2 = absl::lts_20240722::log_internal::MakeCheckOpString<long,long>
                         ((long)index,(long)this->current_size_,"index < current_size_");
    }
    if (psVar2 == (string *)0x0) {
      ppvVar1 = element_at(this,index);
      return (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)*ppvVar1;
    }
  }
  else {
    Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
  }
  plVar4 = local_20;
  Mutable<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
  if (plVar4 != (long *)0x0) {
    pVVar3 = (Value<google::protobuf::internal::GenericTypeHandler<std::string>_> *)
             (**(code **)(*plVar4 + 8))();
    return pVVar3;
  }
  return extraout_RAX;
}

Assistant:

Value<TypeHandler>* Mutable(int index) {
    ABSL_DCHECK_GE(index, 0);
    ABSL_DCHECK_LT(index, current_size_);
    return cast<TypeHandler>(element_at(index));
  }